

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O3

void __thiscall imrt::Ant::printReferencePlan(Ant *this)

{
  int iVar1;
  long *plVar2;
  mapped_type *pmVar3;
  long lVar4;
  long lVar5;
  key_type_conflict local_3c;
  long local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reference plan:",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  if (0 < this->n_stations) {
    lVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Station",7);
      local_38 = lVar5;
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar5);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      local_3c = 0;
      if (0 < this->n_apertures) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Aperture ",9);
          plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_3c);
          std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
          std::ostream::put((char)plVar2);
          std::ostream::flush();
          iVar1 = Collimator::getXdim(this->collimator);
          lVar5 = local_38;
          if (0 < iVar1) {
            lVar4 = 0;
            do {
              pmVar3 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[]((this->ref_plan).
                                    super__Vector_base<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar5,&local_3c);
              plVar2 = (long *)std::ostream::operator<<
                                         ((ostream *)&std::cout,
                                          (pmVar3->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start[lVar4]);
              std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
              std::ostream::put((char)plVar2);
              std::ostream::flush();
              lVar4 = lVar4 + 1;
              iVar1 = Collimator::getXdim(this->collimator);
            } while (lVar4 < iVar1);
          }
          local_3c = local_3c + 1;
        } while (local_3c < this->n_apertures);
      }
      lVar5 = local_38 + 1;
    } while (lVar5 < this->n_stations);
  }
  return;
}

Assistant:

void Ant::printReferencePlan() {
    cout << "--------------------------------------------"<< endl;
    cout << "Reference plan:" << endl;
    cout << "--------------------------------------------"<< endl;
    for (int s=0; s<n_stations; s++) {
      cout << "Station" << s << endl;
      for (int a=0; a<n_apertures; a++) {
        cout << "Aperture " << a << endl;
        for (int i=0; i<collimator.getXdim(); i++) {
          cout << ref_plan[s][a][i] << endl;
          
        }
      }
    }
  }